

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall Uniforms::delDefine(Uniforms *this,string *_define)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->super_Scene).models._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    vera::Model::delDefine(*(Model **)(p_Var1 + 2),_define);
  }
  return;
}

Assistant:

void Uniforms::delDefine(const std::string& _define) {
    for (vera::ModelsMap::iterator it = models.begin(); it != models.end(); ++it)
        it->second->delDefine(_define);
}